

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

QString * QRegularExpression::wildcardToRegularExpression
                    (QStringView pattern,WildcardConversionOptions options)

{
  QStringView v;
  QStringView v_00;
  QStringView v_01;
  QStringView v_02;
  bool bVar1;
  char16_t cVar2;
  qsizetype qVar3;
  const_pointer pvVar4;
  QString *expression;
  undefined4 in_ECX;
  long lVar5;
  QString *in_RDI;
  long in_FS_OFFSET;
  QChar *wc;
  qsizetype i;
  qsizetype wclen;
  QString *rx;
  size_t RuntimeThreshold;
  size_t i_1;
  size_t RuntimeThreshold_1;
  size_t i_2;
  QChar c;
  GlobSettings settings;
  undefined4 in_stack_fffffffffffffdb8;
  WildcardConversionOption in_stack_fffffffffffffdbc;
  QString *in_stack_fffffffffffffdc0;
  char16_t *in_stack_fffffffffffffdc8;
  QChar c_00;
  QStringView *in_stack_fffffffffffffdd0;
  QStringView *this;
  storage_type_conflict *in_stack_fffffffffffffdd8;
  qsizetype in_stack_fffffffffffffde8;
  bool local_201;
  bool local_1f1;
  bool local_1e1;
  anon_class_4_1_38e0b97e *in_stack_fffffffffffffe20;
  bool local_1c9;
  long local_188;
  ulong local_128;
  char16_t *local_100;
  char16_t *local_f0;
  QFlagsStorageHelper<QRegularExpression::WildcardConversionOption,_4> local_cc;
  QStringView local_c8;
  char16_t local_b4;
  char16_t local_b2;
  QChar local_b0;
  QChar local_ae;
  QChar local_ac;
  QChar local_aa;
  QChar local_a8;
  char16_t local_a6;
  QChar local_a4;
  QChar local_a2;
  QChar local_a0;
  char16_t local_9e;
  char16_t local_9c;
  QChar local_9a;
  undefined1 *local_98;
  undefined1 *puStack_90;
  QChar local_7a;
  undefined1 *local_78;
  undefined1 *puStack_70;
  QChar local_62 [11];
  undefined4 local_4c;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined4 local_1c;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c = in_ECX;
  qVar3 = QStringView::size(&local_18);
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x72ecd0);
  QString::reserve((QString *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffde8);
  local_188 = 0;
  pvVar4 = QStringView::data(&local_18);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_4c = local_1c;
  wildcardToRegularExpression::anon_class_4_1_38e0b97e::operator()(in_stack_fffffffffffffe20);
  std::data<char16_t_const,5ul>((char16_t (*) [5])L"(?s:");
  for (local_128 = 0; (local_128 < 5 && (L"(?s:"[local_128] != L'\0')); local_128 = local_128 + 1) {
  }
  QStringView::QStringView<char16_t,_true>
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
             (qsizetype)in_stack_fffffffffffffdc0);
  v.m_data = in_stack_fffffffffffffdd8;
  v.m_size = (qsizetype)in_stack_fffffffffffffdd0;
  QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),v);
  lVar5 = local_188;
  while (local_188 = lVar5, local_188 < qVar3) {
    lVar5 = local_188 + 1;
    local_62[0].ucs = pvVar4[local_188].ucs;
    cVar2 = QChar::unicode(local_62);
    c_00.ucs = (char16_t)((ulong)in_stack_fffffffffffffdc8 >> 0x30);
    switch(cVar2) {
    case L'$':
    case L'(':
    case L')':
    case L'+':
    case L'.':
    case L'\\':
    case L'^':
    case L'{':
    case L'|':
    case L'}':
      QChar::QChar<char16_t,_true>(&local_9a,L'\\');
      QString::operator+=(in_stack_fffffffffffffdc0,
                          (QChar)(char16_t)((ulong)in_stack_fffffffffffffdc8 >> 0x30));
      local_9c = local_62[0].ucs;
      QString::operator+=(in_stack_fffffffffffffdc0,
                          (QChar)(char16_t)((ulong)in_stack_fffffffffffffdc8 >> 0x30));
      break;
    default:
      local_b4 = local_62[0].ucs;
      QString::operator+=(in_stack_fffffffffffffdc0,c_00);
      break;
    case L'*':
      local_78 = puStack_40;
      puStack_70 = local_38;
      v_00.m_data = in_stack_fffffffffffffdd8;
      v_00.m_size = (qsizetype)in_stack_fffffffffffffdd0;
      QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                          v_00);
      local_188 = lVar5;
      while( true ) {
        local_1c9 = false;
        if (local_188 < qVar3) {
          QChar::QChar<char16_t,_true>(&local_7a,L'*');
          local_1c9 = ::operator==((QChar *)in_stack_fffffffffffffdc0,
                                   (QChar *)CONCAT44(in_stack_fffffffffffffdbc,
                                                     in_stack_fffffffffffffdb8));
        }
        lVar5 = local_188;
        if (local_1c9 == false) break;
        local_188 = local_188 + 1;
      }
      break;
    case L'?':
      local_98 = puStack_30;
      puStack_90 = local_28;
      v_01.m_data = in_stack_fffffffffffffdd8;
      v_01.m_size = (qsizetype)in_stack_fffffffffffffdd0;
      QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                          v_01);
      break;
    case L'[':
      local_9e = local_62[0].ucs;
      QString::operator+=(in_stack_fffffffffffffdc0,c_00);
      if (lVar5 < qVar3) {
        QChar::QChar<char16_t,_true>(&local_a0,L'!');
        bVar1 = ::operator==((QChar *)in_stack_fffffffffffffdc0,
                             (QChar *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8))
        ;
        if (bVar1) {
          QChar::QChar<char16_t,_true>(&local_a2,L'^');
          QString::operator+=(in_stack_fffffffffffffdc0,
                              (QChar)(char16_t)((ulong)in_stack_fffffffffffffdc8 >> 0x30));
          lVar5 = local_188 + 2;
        }
        local_188 = lVar5;
        local_1e1 = false;
        if (local_188 < qVar3) {
          QChar::QChar<char16_t,_true>(&local_a4,L']');
          local_1e1 = ::operator==((QChar *)in_stack_fffffffffffffdc0,
                                   (QChar *)CONCAT44(in_stack_fffffffffffffdbc,
                                                     in_stack_fffffffffffffdb8));
        }
        if (local_1e1 != false) {
          local_a6 = pvVar4[local_188].ucs;
          QString::operator+=(in_stack_fffffffffffffdc0,
                              (QChar)(char16_t)((ulong)in_stack_fffffffffffffdc8 >> 0x30));
          local_188 = local_188 + 1;
        }
        while( true ) {
          local_1f1 = false;
          if (local_188 < qVar3) {
            QChar::QChar<char16_t,_true>(&local_a8,L']');
            local_1f1 = ::operator!=((QChar *)in_stack_fffffffffffffdc0,
                                     (QChar *)CONCAT44(in_stack_fffffffffffffdbc,
                                                       in_stack_fffffffffffffdb8));
          }
          lVar5 = local_188;
          if (local_1f1 == false) break;
          bVar1 = QFlags<QRegularExpression::WildcardConversionOption>::testFlag
                            ((QFlags<QRegularExpression::WildcardConversionOption> *)
                             in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
          if (!bVar1) {
            QChar::QChar<char16_t,_true>(&local_aa,L'/');
            bVar1 = ::operator==((QChar *)in_stack_fffffffffffffdc0,
                                 (QChar *)CONCAT44(in_stack_fffffffffffffdbc,
                                                   in_stack_fffffffffffffdb8));
            local_201 = true;
            if (!bVar1) {
              QChar::QChar<char16_t,_true>(&local_ac,(char16_t)local_48);
              local_201 = ::operator==((QChar *)in_stack_fffffffffffffdc0,
                                       (QChar *)CONCAT44(in_stack_fffffffffffffdbc,
                                                         in_stack_fffffffffffffdb8));
            }
            if (local_201 != false) goto LAB_0072f58e;
          }
          QChar::QChar<char16_t,_true>(&local_ae,L'\\');
          bVar1 = ::operator==((QChar *)in_stack_fffffffffffffdc0,
                               (QChar *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8
                                                ));
          if (bVar1) {
            QChar::QChar<char16_t,_true>(&local_b0,L'\\');
            QString::operator+=(in_stack_fffffffffffffdc0,
                                (QChar)(char16_t)((ulong)in_stack_fffffffffffffdc8 >> 0x30));
          }
          local_b2 = pvVar4[local_188].ucs;
          QString::operator+=(in_stack_fffffffffffffdc0,
                              (QChar)(char16_t)((ulong)in_stack_fffffffffffffdc8 >> 0x30));
          local_188 = local_188 + 1;
        }
      }
    }
  }
  this = &local_c8;
  expression = (QString *)std::data<char16_t_const,2ul>((char16_t (*) [2])0x92a84e);
  local_100 = (char16_t *)0x0;
  do {
    if ((char16_t *)0x1 < local_100) {
      local_f0 = (char16_t *)0x2;
LAB_0072f4d4:
      QStringView::QStringView<char16_t,_true>(this,local_f0,(qsizetype)in_stack_fffffffffffffdc0);
      v_02.m_data = (storage_type_conflict *)expression;
      v_02.m_size = (qsizetype)this;
      QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                          v_02);
      local_cc.super_QFlagsStorage<QRegularExpression::WildcardConversionOption>.i =
           (QFlagsStorage<QRegularExpression::WildcardConversionOption>)
           QFlags<QRegularExpression::WildcardConversionOption>::operator&
                     ((QFlags<QRegularExpression::WildcardConversionOption> *)
                      in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
      bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_cc);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        anchoredPattern(expression);
        QString::operator=(in_stack_fffffffffffffdc0,
                           (QString *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8))
        ;
        QString::~QString((QString *)0x72f57b);
      }
LAB_0072f58e:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return in_RDI;
    }
    if (L" depth=(?|\"([^\"]*)\"|([^ }]*))"[(long)(local_100 + 0xe)] == L'\0') {
      local_f0 = local_100;
      goto LAB_0072f4d4;
    }
    local_100 = (char16_t *)((long)local_100 + 1);
  } while( true );
}

Assistant:

QString QRegularExpression::wildcardToRegularExpression(QStringView pattern, WildcardConversionOptions options)
{
    const qsizetype wclen = pattern.size();
    QString rx;
    rx.reserve(wclen + wclen / 16);
    qsizetype i = 0;
    const QChar *wc = pattern.data();

    struct GlobSettings {
        char16_t nativePathSeparator;
        QStringView starEscape;
        QStringView questionMarkEscape;
    };

    const GlobSettings settings = [options]() {
        if (options.testFlag(NonPathWildcardConversion)) {
            return GlobSettings{ u'\0', u".*", u"." };
        } else {
#ifdef Q_OS_WIN
            return GlobSettings{ u'\\', u"[^/\\\\]*", u"[^/\\\\]" };
#else
            return GlobSettings{ u'/', u"[^/]*", u"[^/]" };
#endif
        }
    }();

    // We want a dot to match everything (incl. newlines), so enable /s mode,
    // limited to the pattern string we're producing.
    rx += u"(?s:";

    while (i < wclen) {
        const QChar c = wc[i++];
        switch (c.unicode()) {
        case '*':
            rx += settings.starEscape;
            // Coalesce sequences of *
            while (i < wclen && wc[i] == u'*')
                ++i;
            break;
        case '?':
            rx += settings.questionMarkEscape;
            break;
        // When not using filepath globbing: \ is escaped, / is itself
        // When using filepath globbing:
        // * Unix: \ gets escaped. / is itself
        // * Windows: \ and / can match each other -- they become [/\\] in regexp
        case '\\':
#ifdef Q_OS_WIN
            if (options.testFlag(NonPathWildcardConversion))
                rx += u"\\\\";
            else
                rx += u"[/\\\\]";
            break;
        case '/':
            if (options.testFlag(NonPathWildcardConversion))
                rx += u'/';
            else
                rx += u"[/\\\\]";
            break;
#endif
        case '$':
        case '(':
        case ')':
        case '+':
        case '.':
        case '^':
        case '{':
        case '|':
        case '}':
            rx += u'\\';
            rx += c;
            break;
        case '[':
            rx += c;
            // Support for the [!abc] or [!a-c] syntax
            if (i < wclen) {
                if (wc[i] == u'!') {
                    rx += u'^';
                    ++i;
                }

                if (i < wclen && wc[i] == u']')
                    rx += wc[i++];

                while (i < wclen && wc[i] != u']') {
                    if (!options.testFlag(NonPathWildcardConversion)) {
                        // The '/' appearing in a character class invalidates the
                        // regular expression parsing. It also concerns '\\' on
                        // Windows OS types.
                        if (wc[i] == u'/' || wc[i] == settings.nativePathSeparator)
                            return rx;
                    }
                    if (wc[i] == u'\\')
                        rx += u'\\';
                    rx += wc[i++];
                }
            }
            break;
        default:
            rx += c;
            break;
        }
    }

    // Closes the (?s: group opened above
    rx += u")";

    if (!(options & UnanchoredWildcardConversion))
        rx = anchoredPattern(rx);

    return rx;
}